

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O1

HTS_Boolean HTS_Engine_synthesize(HTS_Engine *engine)

{
  HTS_Boolean HVar1;
  
  HVar1 = HTS_Engine_generate_state_sequence(engine);
  if (((HVar1 != '\0') &&
      (HVar1 = HTS_PStreamSet_create
                         (&engine->pss,&engine->sss,(engine->condition).msd_threshold,
                          (engine->condition).gv_weight), HVar1 == '\x01')) &&
     (HVar1 = HTS_Engine_generate_sample_sequence(engine), HVar1 == '\x01')) {
    return '\x01';
  }
  HTS_Engine_refresh(engine);
  return '\0';
}

Assistant:

static HTS_Boolean HTS_Engine_synthesize(HTS_Engine * engine)
{
   if (HTS_Engine_generate_state_sequence(engine) != TRUE) {
      HTS_Engine_refresh(engine);
      return FALSE;
   }
   if (HTS_Engine_generate_parameter_sequence(engine) != TRUE) {
      HTS_Engine_refresh(engine);
      return FALSE;
   }
   if (HTS_Engine_generate_sample_sequence(engine) != TRUE) {
      HTS_Engine_refresh(engine);
      return FALSE;
   }
   return TRUE;
}